

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexReader::PackedFace::reduce
          (PackedFace *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  byte bVar1;
  uint16_t uVar2;
  DataType DVar3;
  int iVar4;
  PackedFace *this_00;
  int size;
  
  DVar3 = (r->_header).datatype;
  uVar2 = (r->_header).nchannels;
  iVar4 = *(int *)&(this->super_FaceData).field_0xc;
  size = ((1 << (newres.ulog2 & 0x1fU)) << (newres.vlog2 & 0x1fU)) * iVar4;
  this_00 = (PackedFace *)operator_new(0x18);
  PackedFace(this_00,newres,iVar4,size);
  *newMemUsed = (long)size + 0x18;
  bVar1 = (this->super_FaceData)._res.ulog2;
  iVar4 = *(int *)&(this->super_FaceData).field_0xc;
  (*reducefn)(this->_data,iVar4 << (bVar1 & 0x1f),1 << (bVar1 & 0x1f),
              1 << ((this->super_FaceData)._res.vlog2 & 0x1fU),this_00->_data,
              iVar4 << (newres.ulog2 & 0x1fU),DVar3,(int)uVar2);
  return &this_00->super_FaceData;
}

Assistant:

PtexReader::FaceData*
PtexReader::PackedFace::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                               size_t& newMemUsed)
{
    // allocate a new face and reduce image
    DataType dt = r->datatype();
    int nchan = r->nchannels();
    int memsize = _pixelsize * newres.size();
    PackedFace* pf = new PackedFace(newres, _pixelsize, memsize);
    newMemUsed = sizeof(PackedFace) + memsize;
    // reduce and copy into new face
    reducefn(_data, _pixelsize * _res.u(), _res.u(), _res.v(),
             pf->_data, _pixelsize * newres.u(), dt, nchan);
    return pf;
}